

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

int compare2fPoint(void *a,void *b)

{
  if (*b <= *a) {
    if (*b < *a) {
      return 1;
    }
    if (*(float *)((long)b + 4) <= *(float *)((long)a + 4)) {
      return (int)(*(float *)((long)b + 4) < *(float *)((long)a + 4));
    }
  }
  return -1;
}

Assistant:

static int compare2fPoint(const void* a, const void* b)
{
  const float* af = (const float*)a;
  const float* bf = (const float*)b;
  if (af[0] < bf[0])
    return -1;
  if (af[0] > bf[0])
    return 1;
  if (af[1] < bf[1])
    return -1;
  if (af[1] > bf[1])
    return 1;
  return 0;
}